

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O2

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::invoke_clients_handler
          (Reactor<iqnet::Null_lock> *this,Event_handler *handler,HandlerState *hs,bool *terminate)

{
  long lStack_8;
  
  if ((hs->revents & 1U) == 0) {
    if ((hs->revents & 2U) == 0) {
      return;
    }
    lStack_8 = 0x20;
  }
  else {
    lStack_8 = 0x18;
  }
  (**(code **)((long)handler->_vptr_Event_handler + lStack_8))(handler,terminate);
  return;
}

Assistant:

void Reactor<Lock>::invoke_clients_handler(
  Event_handler* handler, HandlerState& hs, bool& terminate )
{
  bool in  = (hs.revents & Reactor_base::INPUT) != 0;
  bool out = (hs.revents & Reactor_base::OUTPUT) != 0;

  if( in )
    handler->handle_input( terminate );
  else if( out )
    handler->handle_output( terminate );
}